

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
          (Question *__return_storage_ptr__,
          ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id,Question *entry)

{
  Question *pQVar1;
  uint *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  bool bVar5;
  undefined8 uVar6;
  Question *extraout_RAX;
  Question *pQVar7;
  uint local_54;
  Fault local_50;
  undefined1 local_48 [42];
  bool local_1e;
  
  local_54 = id;
  if ((int)id < 0) {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
                *)local_48,(uint *)&this->highSlots);
    if ((Entry *)local_48._0_8_ == (Entry *)0x0) {
      local_50.exception = (Exception *)0x0;
      local_48._0_8_ = 0;
      local_48._8_8_ = (uint *)0x0;
      kj::_::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
    kj::
    Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>_>
    ::release((Entry *)local_48,&(this->highSlots).table,(Entry *)local_48._0_8_);
    (__return_storage_ptr__->paramExports).ptr = (uint *)local_48._8_8_;
    (__return_storage_ptr__->paramExports).size_ = local_48._16_8_;
    (__return_storage_ptr__->paramExports).disposer = (ArrayDisposer *)local_48._24_8_;
    (__return_storage_ptr__->selfRef).ptr = (QuestionRef *)local_48._32_8_;
    __return_storage_ptr__->isAwaitingReturn = (bool)local_48[0x28];
    __return_storage_ptr__->isTailCall = (bool)local_48[0x29];
    pQVar7 = (Question *)(ulong)CONCAT11(SUB21(local_48._40_2_,1),local_1e);
    __return_storage_ptr__->skipFinish = local_1e;
  }
  else {
    pQVar7 = (this->slots).builder.ptr;
    (__return_storage_ptr__->paramExports).ptr = pQVar7[id].paramExports.ptr;
    (__return_storage_ptr__->paramExports).size_ = pQVar7[id].paramExports.size_;
    (__return_storage_ptr__->paramExports).disposer = pQVar7[id].paramExports.disposer;
    pQVar7[id].paramExports.ptr = (uint *)0x0;
    pQVar7[id].paramExports.size_ = 0;
    (__return_storage_ptr__->selfRef).ptr = pQVar7[id].selfRef.ptr;
    pQVar7[id].selfRef.ptr = (QuestionRef *)0x0;
    __return_storage_ptr__->skipFinish = pQVar7[id].skipFinish;
    bVar5 = pQVar7[id].isTailCall;
    __return_storage_ptr__->isAwaitingReturn = pQVar7[id].isAwaitingReturn;
    __return_storage_ptr__->isTailCall = bVar5;
    local_48._32_8_ = (QuestionRef *)0x0;
    local_48._16_8_ = 0;
    local_48._24_8_ = (ArrayDisposer *)0x0;
    local_48._0_8_ = 0;
    local_48._8_8_ = (uint *)0x0;
    pQVar1 = (this->slots).builder.ptr;
    pQVar7 = pQVar1 + id;
    puVar2 = pQVar1[id].paramExports.ptr;
    if (puVar2 != (uint *)0x0) {
      sVar3 = (pQVar7->paramExports).size_;
      pAVar4 = (pQVar7->paramExports).disposer;
      (pQVar7->paramExports).ptr = (uint *)0x0;
      (pQVar7->paramExports).size_ = 0;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,4,sVar3,sVar3,0);
    }
    uVar6 = local_48._32_8_;
    (pQVar7->paramExports).ptr = (uint *)0x0;
    (pQVar7->paramExports).size_ = 0;
    (pQVar7->paramExports).disposer = (ArrayDisposer *)0x0;
    (pQVar7->selfRef).ptr = (QuestionRef *)0x0;
    pQVar7->isAwaitingReturn = (bool)local_48[0x20];
    pQVar7->isTailCall = (bool)local_48[0x21];
    local_48[0x22] = SUB81(uVar6,2);
    pQVar7->skipFinish = local_48[0x22];
    local_48._32_8_ = uVar6;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&this->freeIds,&local_54);
    pQVar7 = extraout_RAX;
  }
  return pQVar7;
}

Assistant:

T erase(Id id, T& entry) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    // `entry` is a reference to the entry being released -- we require this in order to prove
    // that the caller has already done a find() to check that this entry exists.  We can't check
    // ourselves because the caller may have nullified the entry in the meantime.

    if (isHigh(id)) {
      auto& slot = KJ_REQUIRE_NONNULL(highSlots.findEntry(id));
      return highSlots.release(slot).value;
    } else {
      KJ_DREQUIRE(&entry == &slots[id]);
      T toRelease = kj::mv(slots[id]);
      slots[id] = T();
      freeIds.push(id);
      return toRelease;
    }
  }